

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O1

S2Point * __thiscall
S2Builder::GetCoverageEndpoint
          (S2Point *__return_storage_ptr__,S2Builder *this,S2Point *p,S2Point *x,S2Point *y,
          S2Point *n)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  dVar6 = n->c_[0];
  dVar7 = n->c_[1];
  dVar1 = n->c_[2];
  dVar10 = dVar1 * dVar1 + dVar7 * dVar7 + dVar6 * dVar6;
  dVar2 = p->c_[0];
  dVar3 = p->c_[1];
  dVar4 = p->c_[2];
  dVar12 = dVar1 * dVar4 + dVar7 * dVar3 + dVar6 * dVar2 + 0.0;
  dVar5 = 1.0 - this->edge_snap_radius_sin2_;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  dVar11 = dVar10 * this->edge_snap_radius_sin2_ - dVar12 * dVar12;
  if (dVar11 <= 0.0) {
    dVar11 = 0.0;
  }
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  dVar8 = (dVar2 * dVar10 - dVar6 * dVar12) * dVar5 + (dVar7 * dVar4 - dVar1 * dVar3) * dVar11;
  dVar9 = (dVar3 * dVar10 - dVar7 * dVar12) * dVar5 + (dVar1 * dVar2 - dVar6 * dVar4) * dVar11;
  dVar7 = (dVar4 * dVar10 - dVar1 * dVar12) * dVar5 + (dVar6 * dVar3 - dVar7 * dVar2) * dVar11;
  dVar6 = dVar7 * dVar7 + dVar9 * dVar9 + dVar8 * dVar8;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  dVar6 = (double)(~-(ulong)(dVar6 != 0.0) & (ulong)dVar6 |
                  (ulong)(1.0 / dVar6) & -(ulong)(dVar6 != 0.0));
  __return_storage_ptr__->c_[0] = dVar8 * dVar6;
  __return_storage_ptr__->c_[1] = dVar9 * dVar6;
  __return_storage_ptr__->c_[2] = dVar7 * dVar6;
  return __return_storage_ptr__;
}

Assistant:

S2Point S2Builder::GetCoverageEndpoint(const S2Point& p, const S2Point& x,
                                       const S2Point& y, const S2Point& n)
    const {
  // Consider the plane perpendicular to P that cuts off a spherical cap of
  // radius snap_radius().  This plane intersects the plane through the edge
  // XY (perpendicular to N) along a line, and that line intersects the unit
  // sphere at two points Q and R, and we want to return the point R that is
  // further along the edge XY toward Y.
  //
  // Let M be the midpoint of QR.  This is the point along QR that is closest
  // to P.  We can now express R as the sum of two perpendicular vectors OM
  // and MR in the plane XY.  Vector MR is in the direction N x P, while
  // vector OM is in the direction (N x P) x N, where N = X x Y.
  //
  // The length of OM can be found using the Pythagorean theorem on triangle
  // OPM, and the length of MR can be found using the Pythagorean theorem on
  // triangle OMR.
  //
  // In the calculations below, we save some work by scaling all the vectors
  // by n.CrossProd(p).Norm2(), and normalizing at the end.
  double n2 = n.Norm2();
  double nDp = n.DotProd(p);
  S2Point nXp = n.CrossProd(p);
  S2Point nXpXn = n2 * p - nDp * n;
  Vector3_d om = sqrt(1 - edge_snap_radius_sin2_) * nXpXn;
  double mr2 = edge_snap_radius_sin2_ * n2 - nDp * nDp;

  // MR is constructed so that it points toward Y (rather than X).
  Vector3_d mr = sqrt(max(0.0, mr2)) * nXp;
  return (om + mr).Normalize();
}